

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpvBuilder.cpp
# Opt level: O1

Id __thiscall
spv::Builder::makePointerDebugType(Builder *this,StorageClass storageClass,Id baseType)

{
  ulong uVar1;
  pointer puVar2;
  iterator __position;
  bool bVar3;
  bool bVar4;
  _Vector_base<spv::Instruction_*,_std::allocator<spv::Instruction_*>_> *p_Var5;
  Id IVar6;
  Id id;
  Id IVar7;
  mapped_type_conflict *pmVar8;
  mapped_type *pmVar9;
  Instruction *pIVar10;
  vector<spv::Instruction*,std::allocator<spv::Instruction*>> *this_00;
  pointer ppIVar11;
  Id IVar12;
  Instruction *type;
  Instruction *local_48;
  _Head_base<0UL,_spv::Instruction_*,_false> local_40;
  Id local_34;
  
  local_34 = baseType;
  pmVar8 = std::
           map<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
           ::operator[](&this->debugId,&local_34);
  IVar7 = *pmVar8;
  if (IVar7 == 0) {
    IVar6 = makeDebugInfoNone(this);
  }
  else {
    IVar6 = makeIntegerType(this,0x20,false);
    id = makeIntConstant(this,IVar6,storageClass,false);
    local_48 = (Instruction *)CONCAT44(local_48._4_4_,3);
    pmVar9 = std::__detail::
             _Map_base<unsigned_int,_std::pair<const_unsigned_int,_std::vector<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::vector<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
             ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_std::vector<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::vector<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                           *)&this->groupedDebugTypes,(key_type *)&local_48);
    ppIVar11 = (pmVar9->super__Vector_base<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>)
               ._M_impl.super__Vector_impl_data._M_start;
    p_Var5 = &pmVar9->super__Vector_base<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>;
    while( true ) {
      bVar4 = ppIVar11 == (p_Var5->_M_impl).super__Vector_impl_data._M_finish;
      IVar6 = (Id)pmVar9;
      if (bVar4) break;
      pIVar10 = *ppIVar11;
      uVar1 = *(pIVar10->idOperand).super__Bvector_base<std::allocator<bool>_>._M_impl.
               super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p;
      if ((uVar1 & 4) == 0) {
LAB_00459fde:
        __assert_fail("idOperand[op]",
                      "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/SPIRV/spvIR.h"
                      ,0xa1,"Id spv::Instruction::getIdOperand(int) const");
      }
      puVar2 = (pIVar10->operands).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
               _M_impl.super__Vector_impl_data._M_start;
      bVar3 = true;
      if (puVar2[2] == IVar7) {
        if ((uVar1 & 8) == 0) goto LAB_00459fde;
        if (puVar2[3] == id) {
          pmVar9 = (mapped_type *)(ulong)pIVar10->resultId;
          bVar3 = false;
        }
      }
      IVar6 = (Id)pmVar9;
      if (!bVar3) break;
      ppIVar11 = ppIVar11 + 1;
    }
    if (bVar4) {
      pIVar10 = (Instruction *)operator_new(0x60);
      IVar12 = this->uniqueId + 1;
      this->uniqueId = IVar12;
      IVar6 = makeVoidType(this);
      pIVar10->_vptr_Instruction = (_func_int **)&PTR__Instruction_00b0d9f8;
      pIVar10->resultId = IVar12;
      pIVar10->typeId = IVar6;
      pIVar10->opCode = OpExtInst;
      (pIVar10->idOperand).super__Bvector_base<std::allocator<bool>_>._M_impl.
      super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
      (pIVar10->idOperand).super__Bvector_base<std::allocator<bool>_>._M_impl.
      super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset = 0;
      (pIVar10->operands).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      (pIVar10->operands).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      (pIVar10->operands).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      (pIVar10->idOperand).super__Bvector_base<std::allocator<bool>_>._M_impl.
      super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
      (pIVar10->idOperand).super__Bvector_base<std::allocator<bool>_>._M_impl.
      super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_offset = 0;
      (pIVar10->idOperand).super__Bvector_base<std::allocator<bool>_>._M_impl.
      super__Bvector_impl_data._M_end_of_storage = (_Bit_pointer)0x0;
      pIVar10->block = (Block *)0x0;
      local_48 = pIVar10;
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::reserve(&pIVar10->operands,5);
      if ((pIVar10->idOperand).super__Bvector_base<std::allocator<bool>_>._M_impl.
          super__Bvector_impl_data._M_end_of_storage ==
          (pIVar10->idOperand).super__Bvector_base<std::allocator<bool>_>._M_impl.
          super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p) {
        std::vector<bool,_std::allocator<bool>_>::_M_reallocate(&pIVar10->idOperand,5);
      }
      Instruction::addIdOperand(local_48,this->nonSemanticShaderDebugInfo);
      Instruction::addImmediateOperand(local_48,3);
      Instruction::addIdOperand(local_48,IVar7);
      Instruction::addIdOperand(local_48,id);
      pIVar10 = local_48;
      IVar7 = makeIntegerType(this,0x20,false);
      IVar7 = makeIntConstant(this,IVar7,0,false);
      Instruction::addIdOperand(pIVar10,IVar7);
      local_40._M_head_impl._0_4_ = 3;
      this_00 = (vector<spv::Instruction*,std::allocator<spv::Instruction*>> *)
                std::__detail::
                _Map_base<unsigned_int,_std::pair<const_unsigned_int,_std::vector<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::vector<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_std::vector<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::vector<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                              *)&this->groupedDebugTypes,(key_type *)&local_40);
      __position._M_current = *(Instruction ***)(this_00 + 8);
      if (__position._M_current == *(Instruction ***)(this_00 + 0x10)) {
        std::vector<spv::Instruction*,std::allocator<spv::Instruction*>>::
        _M_realloc_insert<spv::Instruction*const&>(this_00,__position,&local_48);
      }
      else {
        *__position._M_current = local_48;
        *(long *)(this_00 + 8) = *(long *)(this_00 + 8) + 8;
      }
      local_40._M_head_impl = local_48;
      std::
      vector<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>,std::allocator<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>>>
      ::emplace_back<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>>
                ((vector<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>,std::allocator<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>>>
                  *)&this->constantsTypesGlobals,
                 (unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> *)&local_40);
      if (local_40._M_head_impl != (Instruction *)0x0) {
        (*(local_40._M_head_impl)->_vptr_Instruction[1])();
      }
      Module::mapInstruction(&this->module,local_48);
      IVar6 = local_48->resultId;
    }
  }
  return IVar6;
}

Assistant:

Id Builder::makePointerDebugType(StorageClass storageClass, Id const baseType)
{
    const Id debugBaseType = debugId[baseType];
    if (!debugBaseType) {
        return makeDebugInfoNone();
    }
    const Id scID = makeUintConstant(storageClass);
    for (Instruction* otherType : groupedDebugTypes[NonSemanticShaderDebugInfo100DebugTypePointer]) {
        if (otherType->getIdOperand(2) == debugBaseType &&
            otherType->getIdOperand(3) == scID) {
            return otherType->getResultId();
        }
    }

    Instruction* type = new Instruction(getUniqueId(), makeVoidType(), OpExtInst);
    type->reserveOperands(5);
    type->addIdOperand(nonSemanticShaderDebugInfo);
    type->addImmediateOperand(NonSemanticShaderDebugInfo100DebugTypePointer);
    type->addIdOperand(debugBaseType);
    type->addIdOperand(scID);
    type->addIdOperand(makeUintConstant(0));

    groupedDebugTypes[NonSemanticShaderDebugInfo100DebugTypePointer].push_back(type);
    constantsTypesGlobals.push_back(std::unique_ptr<Instruction>(type));
    module.mapInstruction(type);

    return type->getResultId();
}